

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O1

vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
* vkt::wsi::anon_unknown_0::createFences
            (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
             *__return_storage_ptr__,DeviceInterface *vkd,VkDevice device,size_t numFences)

{
  int *piVar1;
  pointer pSVar2;
  long *plVar3;
  deUint64 *pdVar4;
  long *plVar5;
  long lVar6;
  Move<vk::Handle<(vk::HandleType)6>_> local_68;
  DeviceInterface *local_40;
  VkDevice local_38;
  
  local_40 = vkd;
  local_38 = device;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ::vector(__return_storage_ptr__,numFences,(allocator_type *)&local_68);
  if (numFences != 0) {
    lVar6 = 8;
    do {
      pdVar4 = (deUint64 *)operator_new(0x20);
      ::vk::createFence(&local_68,local_40,local_38,0,(VkAllocationCallbacks *)0x0);
      pdVar4[2] = (deUint64)
                  local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device;
      pdVar4[3] = (deUint64)
                  local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator;
      *pdVar4 = local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
      pdVar4[1] = (deUint64)
                  local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                  m_deviceIface;
      local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
      local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = (VkDevice)0x0
      ;
      local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      plVar5 = (long *)operator_new(0x20);
      *(undefined4 *)(plVar5 + 1) = 0;
      *(undefined4 *)((long)plVar5 + 0xc) = 0;
      *plVar5 = (long)&PTR__SharedPtrState_00d1df50;
      plVar5[2] = (long)pdVar4;
      *(undefined4 *)(plVar5 + 1) = 1;
      *(undefined4 *)((long)plVar5 + 0xc) = 1;
      pSVar2 = (__return_storage_ptr__->
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      plVar3 = *(long **)((long)&pSVar2->m_ptr + lVar6);
      if (plVar3 != plVar5) {
        if (plVar3 != (long *)0x0) {
          LOCK();
          plVar3 = plVar3 + 1;
          *(int *)plVar3 = (int)*plVar3 + -1;
          UNLOCK();
          if ((int)*plVar3 == 0) {
            *(undefined8 *)((long)pSVar2 + lVar6 + -8) = 0;
            (**(code **)(**(long **)((long)&pSVar2->m_ptr + lVar6) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)&pSVar2->m_ptr + lVar6) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar3 = *(long **)((long)&pSVar2->m_ptr + lVar6);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
            *(undefined8 *)((long)&pSVar2->m_ptr + lVar6) = 0;
          }
        }
        *(deUint64 **)((long)pSVar2 + lVar6 + -8) = pdVar4;
        *(long **)((long)&pSVar2->m_ptr + lVar6) = plVar5;
        LOCK();
        *(int *)(plVar5 + 1) = (int)plVar5[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pSVar2->m_ptr + lVar6) + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar3 = plVar5 + 1;
      *(int *)plVar3 = (int)*plVar3 + -1;
      UNLOCK();
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar5 + 0x10))(plVar5);
      }
      LOCK();
      piVar1 = (int *)((long)plVar5 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar5 + 8))(plVar5);
      }
      if (local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                  (&local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
                   (VkFence)local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                            m_internal);
      }
      lVar6 = lVar6 + 0x10;
      numFences = numFences - 1;
    } while (numFences != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<FenceSp> createFences (const DeviceInterface&	vkd,
							  const VkDevice			device,
							  size_t					numFences)
{
	vector<FenceSp> fences(numFences);

	for (size_t ndx = 0; ndx < numFences; ++ndx)
		fences[ndx] = FenceSp(new Unique<VkFence>(createFence(vkd, device)));

	return fences;
}